

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O3

void Curl_pgrsResetTimesSizes(SessionHandle *data)

{
  int *piVar1;
  
  (data->progress).size_dl = 0;
  (data->progress).size_ul = 0;
  (data->progress).t_nslookup = 0.0;
  (data->progress).t_connect = 0.0;
  (data->progress).t_pretransfer = 0.0;
  (data->progress).t_starttransfer = 0.0;
  piVar1 = &(data->progress).flags;
  *(byte *)piVar1 = (byte)*piVar1 & 0x9f;
  return;
}

Assistant:

void Curl_pgrsResetTimesSizes(struct SessionHandle *data)
{
  data->progress.t_nslookup = 0.0;
  data->progress.t_connect = 0.0;
  data->progress.t_pretransfer = 0.0;
  data->progress.t_starttransfer = 0.0;

  Curl_pgrsSetDownloadSize(data, -1);
  Curl_pgrsSetUploadSize(data, -1);
}